

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloom_filter.hpp
# Opt level: O2

void __thiscall bloom_filter::insert(bloom_filter *this,uchar *key_begin,size_t *length)

{
  byte *pbVar1;
  pointer puVar2;
  size_t i;
  ulong uVar3;
  ulong local_48;
  size_t bit_index;
  size_t bit;
  
  local_48 = 0;
  bit_index = 0;
  for (uVar3 = 0;
      puVar2 = (this->salt_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
               .super__Vector_impl_data._M_start,
      uVar3 < (ulong)((long)(this->salt_).
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_finish - (long)puVar2 >> 2);
      uVar3 = uVar3 + 1) {
    bit._4_4_ = hash_ap(this,key_begin,*length,puVar2[uVar3]);
    (*this->_vptr_bloom_filter[4])(this,(long)&bit + 4,&local_48,&bit_index);
    pbVar1 = (this->bit_table_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_start + (local_48 >> 3);
    *pbVar1 = *pbVar1 | bit_mask[bit_index];
  }
  this->inserted_element_count_ = this->inserted_element_count_ + 1;
  return;
}

Assistant:

inline void insert(const unsigned char* key_begin, const std::size_t& length)
   {
      std::size_t bit_index = 0;
      std::size_t bit       = 0;

      for (std::size_t i = 0; i < salt_.size(); ++i)
      {
         compute_indices(hash_ap(key_begin, length, salt_[i]), bit_index, bit);

         bit_table_[bit_index / bits_per_char] |= bit_mask[bit];
      }

      ++inserted_element_count_;
   }